

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.h
# Opt level: O1

void __thiscall
CVmMetaclassHTTPRequest::create_for_image_load(CVmMetaclassHTTPRequest *this,vm_obj_id_t id)

{
  long lVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)CVmObject::operator_new(0x10,id);
  *puVar2 = &PTR_get_metaclass_reg_00352000;
  puVar2[1] = 0;
  lVar1 = (ulong)((id & 0xfff) << 3) * 3;
  *(ushort *)(&G_obj_table_X.pages_[id >> 0xc]->field_0x14 + lVar1) =
       *(ushort *)(&G_obj_table_X.pages_[id >> 0xc]->field_0x14 + lVar1) & 63999;
  *(ushort *)(&G_obj_table_X.pages_[id >> 0xc]->field_0x14 + lVar1) =
       *(ushort *)(&G_obj_table_X.pages_[id >> 0xc]->field_0x14 + lVar1) | 0x80;
  return;
}

Assistant:

void create_for_image_load(VMG_ vm_obj_id_t id)
    {
        new (vmg_ id) CVmObjHTTPRequest();
        G_obj_table->set_obj_gc_characteristics(id, FALSE, FALSE);
        G_obj_table->set_obj_transient(id);
    }